

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_hashtable.cpp
# Opt level: O1

void __thiscall
duckdb::GroupedAggregateHashTable::InitializeUnpartitionedData(GroupedAggregateHashTable *this)

{
  unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
  *this_00;
  BufferManager *buffer_manager;
  pointer pLVar1;
  pointer pLVar2;
  _Head_base<0UL,_duckdb::PartitionedTupleData_*,_false> _Var3;
  pointer pPVar4;
  TupleDataLayout *pTVar5;
  _Head_base<0UL,_duckdb::PartitionedTupleData_*,_false> this_01;
  shared_ptr<duckdb::TupleDataLayout,_true> local_38;
  
  this_00 = &this->unpartitioned_data;
  if ((this->unpartitioned_data).
      super_unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::PartitionedTupleData_*,_std::default_delete<duckdb::PartitionedTupleData>_>
      .super__Head_base<0UL,_duckdb::PartitionedTupleData_*,_false>._M_head_impl ==
      (PartitionedTupleData *)0x0) {
    buffer_manager = (this->super_BaseAggregateHashTable).buffer_manager;
    pTVar5 = shared_ptr<duckdb::TupleDataLayout,_true>::operator->
                       (&(this->super_BaseAggregateHashTable).layout_ptr);
    pLVar1 = (pTVar5->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
             .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pLVar2 = (pTVar5->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
             .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start;
    this_01._M_head_impl = (PartitionedTupleData *)operator_new(0x90);
    local_38.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (this->super_BaseAggregateHashTable).layout_ptr.internal.
           super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_38.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (this->super_BaseAggregateHashTable).layout_ptr.internal.
         super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_38.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_38.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_38.internal.
              super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_38.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_38.internal.
              super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    RadixPartitionedTupleData::RadixPartitionedTupleData
              ((RadixPartitionedTupleData *)this_01._M_head_impl,buffer_manager,&local_38,0,
               ((long)pLVar1 - (long)pLVar2 >> 3) * -0x5555555555555555 - 1);
    if (local_38.internal.super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_38.internal.
                 super___shared_ptr<duckdb::TupleDataLayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
    }
    _Var3._M_head_impl =
         (this_00->
         super_unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
         )._M_t.
         super___uniq_ptr_impl<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::PartitionedTupleData_*,_std::default_delete<duckdb::PartitionedTupleData>_>
         .super__Head_base<0UL,_duckdb::PartitionedTupleData_*,_false>._M_head_impl;
    (this_00->
    super_unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
    )._M_t.
    super___uniq_ptr_impl<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::PartitionedTupleData_*,_std::default_delete<duckdb::PartitionedTupleData>_>
    .super__Head_base<0UL,_duckdb::PartitionedTupleData_*,_false>._M_head_impl =
         this_01._M_head_impl;
    if (_Var3._M_head_impl != (PartitionedTupleData *)0x0) {
      (**(code **)((long)(_Var3._M_head_impl)->_vptr_PartitionedTupleData + 8))();
    }
  }
  else {
    pPVar4 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
             ::operator->(this_00);
    PartitionedTupleData::Reset(pPVar4);
  }
  pPVar4 = unique_ptr<duckdb::PartitionedTupleData,_std::default_delete<duckdb::PartitionedTupleData>,_true>
           ::operator->(this_00);
  PartitionedTupleData::InitializeAppendState
            (pPVar4,&(this->state).unpartitioned_append_state,KEEP_EVERYTHING_PINNED);
  return;
}

Assistant:

void GroupedAggregateHashTable::InitializeUnpartitionedData() {
	D_ASSERT(radix_bits >= UNPARTITIONED_RADIX_BITS_THRESHOLD);
	if (!unpartitioned_data) {
		unpartitioned_data =
		    make_uniq<RadixPartitionedTupleData>(buffer_manager, layout_ptr, 0ULL, layout_ptr->ColumnCount() - 1);
	} else {
		unpartitioned_data->Reset();
	}
	unpartitioned_data->InitializeAppendState(state.unpartitioned_append_state,
	                                          TupleDataPinProperties::KEEP_EVERYTHING_PINNED);
}